

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O0

ssize_t __thiscall ParticleFilter::write(ParticleFilter *this,int __fd,void *__buf,size_t __n)

{
  const_reference pvVar1;
  ostream *poVar2;
  ssize_t sVar3;
  uint local_228;
  uint i;
  string local_218 [8];
  ofstream dataFile;
  string *filename_local;
  ParticleFilter *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,__fd);
  for (local_228 = 0; local_228 < this->num_particles; local_228 = local_228 + 1) {
    pvVar1 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(ulong)local_228);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,pvVar1->x);
    poVar2 = std::operator<<(poVar2," ");
    pvVar1 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(ulong)local_228);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar1->y);
    poVar2 = std::operator<<(poVar2," ");
    pvVar1 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(ulong)local_228);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar1->theta);
    std::operator<<(poVar2,"\n");
  }
  std::ofstream::close();
  sVar3 = std::ofstream::~ofstream(local_218);
  return sVar3;
}

Assistant:

void ParticleFilter::write(std::string filename) const {
	// You don't need to modify this file.
	std::ofstream dataFile;
	dataFile.open(filename, std::ios::app);
	for (unsigned int i = 0; i < num_particles; ++i) {
		dataFile << particles[i].x << " " << particles[i].y << " " << particles[i].theta << "\n";
	}
	dataFile.close();
}